

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O3

ptr<resp_msg> __thiscall nuraft::raft_server::handle_prevote_req(raft_server *this,req_msg *req)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer psVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  native_handle_type nVar7;
  _func_int **pp_Var8;
  int iVar9;
  undefined1 *puVar10;
  long lVar11;
  element_type *peVar12;
  long in_RDX;
  undefined **ppuVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  char *pcVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  ptr<resp_msg> pVar17;
  string local_a8;
  undefined8 *local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined1 local_6f [7];
  pointer local_68;
  raft_server *local_60;
  undefined8 local_58;
  undefined8 local_50;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_48;
  undefined8 *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_a8._M_dataplus._M_p._0_4_ = *(undefined4 *)(in_RDX + 0x14);
  local_48._M_cur =
       (__node_type *)
       std::
       _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)(req + 6),(key_type *)&local_a8);
  bVar15 = local_48._M_cur == (__node_type *)0x0;
  psVar4 = req[9].log_entries_.
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((psVar4 != (pointer)0x0) &&
     (iVar9 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
     3 < iVar9)) {
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar9 = *(int *)&req[8].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88 = &local_78;
    if (iVar9 == 3) {
      puVar10 = (undefined1 *)((long)&local_78 + 6);
      local_78 = CONCAT26(local_78._6_2_,0x726500000000);
      local_78 = CONCAT44(local_78._4_4_,0x6461656c);
      local_80 = 6;
    }
    else if (iVar9 == 2) {
      puVar10 = local_6f;
      local_78 = 0x74616469646e6163;
      local_70 = 0x65;
      local_80 = 9;
    }
    else if (iVar9 == 1) {
      puVar10 = &local_70;
      local_78 = 0x7265776f6c6c6f66;
      local_80 = 8;
    }
    else {
      puVar10 = (undefined1 *)((long)&local_78 + 7);
      local_78 = CONCAT17(local_78._7_1_,0x4e574f4e000000);
      local_78 = CONCAT44(local_78._4_4_,0x4e4b4e55);
      local_80 = 7;
    }
    *puVar10 = 0;
    uVar1 = *(uint *)(in_RDX + 0x14);
    uVar5 = *(undefined8 *)(in_RDX + 0x20);
    local_60 = this;
    (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x20))(&local_40);
    uVar6 = *local_40;
    local_58 = *(undefined8 *)(in_RDX + 0x28);
    local_68 = psVar4;
    local_50 = uVar5;
    lVar11 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
    pcVar14 = "HB dead";
    if ((req[2].last_log_term_ & 1) != 0) {
      pcVar14 = "HB alive";
    }
    msg_if_given_abi_cxx11_
              (&local_a8,
               "[PRE-VOTE REQ] my role %s, from peer %d, log term: req %lu / mine %lu\nlast idx: req %lu / mine %lu, term: req %lu / mine %lu\n%s"
               ,&local_78,(ulong)uVar1,local_50,uVar6,local_58,lVar11 + -1,
               *(undefined8 *)(in_RDX + 8),req[9].super_msg_base._vptr_msg_base[1],pcVar14);
    (*(code *)(local_68->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)(local_68,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_prevote_req",0x19d,&local_a8);
    this = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_) !=
        &local_a8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_));
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
  }
  nVar7 = *(native_handle_type *)(in_RDX + 8);
  uVar2 = *(undefined4 *)(in_RDX + 0x14);
  peVar12 = (element_type *)operator_new(0xb0);
  (peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar12->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_00162270;
  uVar3 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (peVar12->bg_commit_thread_)._M_id._M_thread = nVar7;
  *(undefined4 *)&(peVar12->bg_append_thread_)._M_id._M_thread = 0x15;
  *(undefined4 *)((long)&(peVar12->bg_append_thread_)._M_id._M_thread + 4) = uVar3;
  *(undefined4 *)&peVar12->bg_append_ea_ = uVar2;
  ppuVar13 = &PTR__resp_msg_001622c0;
  (peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_001622c0;
  *(ulong *)&peVar12->initialized_ = -(ulong)bVar15;
  peVar12->id_ = 0;
  peVar12->my_priority_ = 0;
  *(undefined1 *)&peVar12->target_priority_ = 0;
  (peVar12->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar12->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar12->votes_responded_ = 0;
  peVar12->votes_granted_ = 0;
  (peVar12->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)((long)&(peVar12->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18)
       = 0;
  *(undefined8 *)((long)&(peVar12->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20)
       = 0;
  *(undefined8 *)((long)&(peVar12->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)((long)&(peVar12->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)&(peVar12->priority_change_timer_).first_event_fired_ = 0;
  (peVar12->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  (peVar12->priority_change_timer_).t_created_.__d.__r = 0;
  (peVar12->priority_change_timer_).duration_us_ = 0;
  *(undefined4 *)&(peVar12->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar12;
  this->_vptr_raft_server =
       (_func_int **)
       &(peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (((((ulong)req[2].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) != 0) &&
      (psVar4 = req[9].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage, psVar4 != (pointer)0x0)) &&
     (iVar9 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
     ppuVar13 = (undefined **)extraout_RDX, 3 < iVar9)) {
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_(&local_a8,"this server is catching up, always accept pre-vote");
    (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar4,4,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
      ,"handle_prevote_req",0x1ad,&local_a8);
    ppuVar13 = (undefined **)extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_) !=
        &local_a8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_));
      ppuVar13 = (undefined **)extraout_RDX_01;
    }
  }
  if (((req[2].last_log_term_ & 1) == 0) ||
     (((ulong)req[2].log_entries_.
              super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) != 0)) {
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar4 != (pointer)0x0) &&
       (iVar9 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
       3 < iVar9)) {
      psVar4 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_(&local_a8,"pre-vote decision: O (grant)");
      (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar4,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                        ,"handle_prevote_req",0x1b0,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_) !=
          &local_a8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_));
      }
    }
    pp_Var8 = this->_vptr_raft_server;
    auVar16 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
    ppuVar13 = auVar16._8_8_;
    pp_Var8[4] = auVar16._0_8_;
    *(undefined1 *)(pp_Var8 + 6) = 1;
    goto LAB_0011b187;
  }
  psVar4 = req[9].log_entries_.
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (local_48._M_cur == (__node_type *)0x0) {
    if ((psVar4 == (pointer)0x0) ||
       (iVar9 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
       ppuVar13 = (undefined **)extraout_RDX_04, iVar9 < 4)) goto LAB_0011b187;
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_(&local_a8,"pre-vote decision: XX (strong deny, non-existing node)");
    (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar4,4,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
      ,"handle_prevote_req",0x1b6,&local_a8);
    puVar10 = (undefined1 *)
              CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_);
    ppuVar13 = (undefined **)extraout_RDX_05;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10 == &local_a8.field_2) goto LAB_0011b187;
  }
  else {
    if ((psVar4 == (pointer)0x0) ||
       (iVar9 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
       ppuVar13 = (undefined **)extraout_RDX_02, iVar9 < 4)) goto LAB_0011b187;
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_(&local_a8,"pre-vote decision: X (deny)");
    (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar4,4,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
      ,"handle_prevote_req",0x1b4,&local_a8);
    puVar10 = (undefined1 *)
              CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_);
    ppuVar13 = (undefined **)extraout_RDX_03;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10 == &local_a8.field_2) goto LAB_0011b187;
  }
  operator_delete(puVar10);
  ppuVar13 = (undefined **)extraout_RDX_06;
LAB_0011b187:
  pVar17.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar13;
  pVar17.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar17.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_prevote_req(req_msg& req) {
    ulong next_idx_for_resp = 0;
    auto entry = peers_.find(req.get_src());
    if (entry == peers_.end()) {
        // This node already has been removed, set a special value.
        next_idx_for_resp = std::numeric_limits<ulong>::max();
    }

    p_in("[PRE-VOTE REQ] my role %s, from peer %d, "
         "log term: req %" PRIu64 " / mine %" PRIu64 "\n"
         "last idx: req %" PRIu64 " / mine %" PRIu64
         ", term: req %" PRIu64 " / mine %" PRIu64 "\n"
         "%s",
         srv_role_to_string(role_).c_str(),
         req.get_src(), req.get_last_log_term(),
         log_store_->last_entry()->get_term(),
         req.get_last_log_idx(), log_store_->next_slot()-1,
         req.get_term(), state_->get_term(),
         (hb_alive_) ? "HB alive" : "HB dead");

    ptr<resp_msg> resp
        ( cs_new<resp_msg>
          ( req.get_term(),
            msg_type::pre_vote_response,
            id_,
            req.get_src(),
            next_idx_for_resp ) );

    // NOTE:
    //   While `catching_up_` flag is on, this server does not get
    //   normal append_entries request so that `hb_alive_` may not
    //   be cleared properly. Hence, it should accept any pre-vote
    //   requests.
    if (catching_up_) {
        p_in("this server is catching up, always accept pre-vote");
    }
    if (!hb_alive_ || catching_up_) {
        p_in("pre-vote decision: O (grant)");
        resp->accept(log_store_->next_slot());
    } else {
        if (next_idx_for_resp != std::numeric_limits<ulong>::max()) {
            p_in("pre-vote decision: X (deny)");
        } else {
            p_in("pre-vote decision: XX (strong deny, non-existing node)");
        }
    }

    return resp;
}